

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O2

uint32_t hash(uint32_t a)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = a >> ((byte)c._M_elems[1] & 0x1f) ^ c._M_elems[0] ^ a;
  iVar3 = uVar1 << ((byte)c._M_elems[2] & 0x1f);
  if (c._M_elems[2] == 0) {
    iVar3 = 0;
  }
  uVar1 = iVar3 + uVar1;
  uVar2 = uVar1 >> ((byte)c._M_elems[3] & 0x1f);
  if (c._M_elems[3] == 0) {
    uVar2 = 0;
  }
  uVar2 = (c._M_elems[4] + 1) * (uVar2 ^ uVar1);
  uVar1 = uVar2 >> ((byte)c._M_elems[5] & 0x1f);
  if (c._M_elems[5] == 0) {
    uVar1 = 0;
  }
  return uVar1 ^ uVar2;
}

Assistant:

static uint32_t hash(uint32_t a){
    a =  (a ^ c[0]) ^ (a >> c[1]);
    a += (a << c[2])*(c[2]!=0);
    a ^= (a >> c[3])*(c[3]!=0);
    a *= c[4]+1;
    a ^= (a >> c[5])*(c[5]!=0);
    return a;
}